

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

int Gia_ManHashXorReal(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  uint iLit1_00;
  uint uVar6;
  
  if (p->fAddStrash != 0) {
    __assert_fail("p->fAddStrash == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                  ,0x1d8,"int Gia_ManHashXorReal(Gia_Man_t *, int, int)");
  }
  if (iLit0 < 2) {
    uVar5 = iLit1;
    if (iLit0 != 0) {
      if (iLit1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10e,"int Abc_LitNot(int)");
      }
      uVar5 = iLit1 ^ 1;
    }
  }
  else if (iLit1 < 2) {
    uVar5 = (uint)(iLit1 != 0) ^ iLit0;
  }
  else {
    uVar5 = 0;
    if (iLit0 != iLit1) {
      uVar6 = iLit1 ^ iLit0;
      uVar5 = 1;
      if (uVar6 != 1) {
        if (((char)p->nObjs == '\0') &&
           (p->nHTable * 2 < p->nObjs + ~(p->vCos->nSize + p->vCis->nSize))) {
          Gia_ManHashResize(p);
        }
        uVar5 = iLit1;
        if (iLit1 < iLit0) {
          uVar5 = iLit0;
        }
        if (iLit0 < iLit1) {
          iLit1 = iLit0;
        }
        if (((int)uVar5 < 0) || (iLit1 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10d,"int Abc_LitIsCompl(int)");
        }
        uVar5 = uVar5 & 0x7ffffffe;
        iLit1_00 = iLit1 & 0x7ffffffe;
        puVar4 = (uint *)Gia_ManHashFind(p,uVar5,iLit1_00,-1);
        uVar3 = *puVar4;
        if (uVar3 == 0) {
          p->nHashMiss = p->nHashMiss + 1;
          iVar1 = p->nObjs;
          iVar2 = p->nObjsAlloc;
          uVar3 = Gia_ManAppendXorReal(p,uVar5,iLit1_00);
          if ((iVar2 <= iVar1) &&
             (puVar4 = (uint *)Gia_ManHashFind(p,uVar5,iLit1_00,-1), *puVar4 != 0)) {
            __assert_fail("*pPlace == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                          ,0x1f7,"int Gia_ManHashXorReal(Gia_Man_t *, int, int)");
          }
          *puVar4 = uVar3;
        }
        else {
          p->nHashHit = p->nHashHit + 1;
        }
        if ((int)uVar3 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10f,"int Abc_LitNotCond(int, int)");
        }
        uVar5 = uVar3 ^ uVar6 & 1;
      }
    }
  }
  return uVar5;
}

Assistant:

int Gia_ManHashXorReal( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    int fCompl = 0;
    assert( p->fAddStrash == 0 );
    if ( iLit0 < 2 )
        return iLit0 ? Abc_LitNot(iLit1) : iLit1;
    if ( iLit1 < 2 )
        return iLit1 ? Abc_LitNot(iLit0) : iLit0;
    if ( iLit0 == iLit1 )
        return 0;
    if ( iLit0 == Abc_LitNot(iLit1) )
        return 1;
    if ( (p->nObjs & 0xFF) == 0 && 2 * p->nHTable < Gia_ManAndNum(p) )
        Gia_ManHashResize( p );
    if ( iLit0 < iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1;
    if ( Abc_LitIsCompl(iLit0) )
        iLit0 = Abc_LitNot(iLit0), fCompl ^= 1;
    if ( Abc_LitIsCompl(iLit1) )
        iLit1 = Abc_LitNot(iLit1), fCompl ^= 1;
    {
        int *pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
        if ( *pPlace )
        {
            p->nHashHit++;
            return Abc_LitNotCond( *pPlace, fCompl );
        }
        p->nHashMiss++;
        if ( p->nObjs < p->nObjsAlloc )
            *pPlace = Gia_ManAppendXorReal( p, iLit0, iLit1 );
        else
        {
            int iNode = Gia_ManAppendXorReal( p, iLit0, iLit1 );
            pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
            assert( *pPlace == 0 );
            *pPlace = iNode;
        }
        return Abc_LitNotCond( *pPlace, fCompl );
    }
}